

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  Node *block;
  int iVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  int *piVar4;
  TValue *pTVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_3c;
  
  uVar7 = t->sizearray;
  uVar9 = (ulong)uVar7;
  if (t->lastfree == (Node *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  uVar10 = (ulong)nasize;
  if (uVar7 < nasize) {
    pTVar3 = (TValue *)luaM_realloc_(L,t->array,uVar9 << 4,uVar10 << 4);
    t->array = pTVar3;
    uVar6 = (ulong)t->sizearray;
    piVar4 = &pTVar3[uVar6].tt_;
    for (; uVar6 < uVar10; uVar6 = uVar6 + 1) {
      *piVar4 = 0;
      piVar4 = piVar4 + 4;
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < uVar7) {
    t->sizearray = nasize;
    lVar8 = uVar10 << 4;
    uVar6 = uVar10;
    while (pTVar3 = t->array, uVar6 < uVar9) {
      uVar6 = uVar6 + 1;
      if (*(int *)((long)&pTVar3->tt_ + lVar8) != 0) {
        luaH_setint(L,t,uVar6,(TValue *)((long)&pTVar3->value_ + lVar8));
      }
      lVar8 = lVar8 + 0x10;
    }
    pTVar3 = (TValue *)luaM_realloc_(L,pTVar3,uVar9 << 4,uVar10 << 4);
    t->array = pTVar3;
  }
  pTVar3 = (TValue *)&block[(ulong)local_3c - 1].i_key;
  for (uVar7 = local_3c; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
    if (pTVar3[-1].tt_ != 0) {
      pTVar5 = luaH_set(L,t,pTVar3);
      iVar1 = pTVar3[-1].tt_;
      uVar2 = *(undefined4 *)&pTVar3[-1].field_0xc;
      pTVar5->value_ = pTVar3[-1].value_;
      pTVar5->tt_ = iVar1;
      *(undefined4 *)&pTVar5->field_0xc = uVar2;
    }
    pTVar3 = pTVar3 + -2;
  }
  if (0 < (int)local_3c) {
    luaM_realloc_(L,block,(ulong)local_3c * 0x20,0);
    return;
  }
  return;
}

Assistant:

void luaH_resize(lua_State *L, Table *t, unsigned int nasize,
                 unsigned int nhsize) {
    unsigned int i;
    int j;
    unsigned int oldasize = t->sizearray;
    int oldhsize = allocsizenode(t);
    Node *nold = t->node;  /* save old hash ... */
    if (nasize > oldasize)  /* array part must grow? */
        setarrayvector(L, t, nasize);
    /* create new hash part with appropriate size */
    setnodevector(L, t, nhsize);
    if (nasize < oldasize) {  /* array part must shrink? */
        t->sizearray = nasize;
        /* re-insert elements from vanishing slice */
        for (i = nasize; i < oldasize; i++) {
            if (!ttisnil(&t->array[i]))
                luaH_setint(L, t, i + 1, &t->array[i]);
        }
        /* shrink array */
        luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
    }
    /* re-insert elements from hash part */
    for (j = oldhsize - 1; j >= 0; j--) {
        Node *old = nold + j;
        if (!ttisnil(gval(old))) {
            /* doesn't need barrier/invalidate cache, as entry was
               already present in the table */
            setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
        }
    }
    if (oldhsize > 0)  /* not the dummy node? */
        luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}